

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevcStreamReader.cpp
# Opt level: O0

int __thiscall
HEVCStreamReader::getTSDescriptor
          (HEVCStreamReader *this,uint8_t *dstBuff,bool blurayMode,bool hdmvDescriptors)

{
  byte bVar1;
  bool interlaced;
  uint8_t uVar2;
  uint width;
  uint height;
  VideoAspectRatio ar;
  int iVar3;
  uint8_t *puVar4;
  byte *pbVar5;
  double fps;
  int toDecode;
  uint8_t *nextNal;
  byte *pbStack_2d0;
  NalType nalType;
  uint8_t *nal;
  uint8_t tmpBuffer [512];
  undefined1 local_c0;
  uint8_t aspect_ratio_index;
  uint8_t frame_rate_index;
  uint8_t video_format;
  int lenDoviDesc;
  CheckStreamRez rez;
  bool hdmvDescriptors_local;
  uint8_t *puStack_18;
  bool blurayMode_local;
  uint8_t *dstBuff_local;
  HEVCStreamReader *this_local;
  
  rez._158_1_ = hdmvDescriptors;
  rez._159_1_ = blurayMode;
  if ((this->m_firstFrame & 1U) != 0) {
    checkStream((CheckStreamRez *)&local_c0,this,
                (this->super_MPEGStreamReader).super_AbstractStreamReader.m_buffer,
                (int)(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd -
                (int)(this->super_MPEGStreamReader).super_AbstractStreamReader.m_buffer);
    CheckStreamRez::~CheckStreamRez((CheckStreamRez *)&local_c0);
  }
  tmpBuffer[0x1fc] = '\0';
  tmpBuffer[0x1fd] = '\0';
  tmpBuffer[0x1fe] = '\0';
  tmpBuffer[0x1ff] = '\0';
  puStack_18 = dstBuff;
  if (((rez._159_1_ & 1) == 0) && ((this->m_hdr->isDVRPU & 1U) != 0)) {
    builtin_memcpy(dstBuff,"\x05\x04DOVI",6);
    puStack_18 = dstBuff + 6;
    tmpBuffer[0x1fc] = '\x06';
    tmpBuffer[0x1fd] = '\0';
    tmpBuffer[0x1fe] = '\0';
    tmpBuffer[0x1ff] = '\0';
  }
  if ((rez._158_1_ & 1) == 0) {
    for (pbStack_2d0 = NALUnit::findNextNAL
                                 ((this->super_MPEGStreamReader).super_AbstractStreamReader.m_buffer
                                  ,(this->super_MPEGStreamReader).super_AbstractStreamReader.
                                   m_bufEnd);
        pbStack_2d0 < (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd + -4;
        pbStack_2d0 = NALUnit::findNextNAL
                                (pbStack_2d0,
                                 (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd)
        ) {
      bVar1 = *pbStack_2d0;
      puVar4 = NALUnit::findNALWithStartCode
                         (pbStack_2d0,
                          (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd,true);
      if (((int)(uint)bVar1 >> 1 & 0x3fU) == 0x21) {
        if ((uint)((int)puVar4 - (int)pbStack_2d0) < 0x1f8) {
          iVar3 = (int)puVar4 - (int)pbStack_2d0;
        }
        else {
          iVar3 = 0x1f8;
        }
        NALUnit::decodeNAL(pbStack_2d0,pbStack_2d0 + iVar3,(uint8_t *)&nal,0x200);
        break;
      }
    }
    *puStack_18 = '8';
    puStack_18[1] = '\r';
    *(undefined8 *)(puStack_18 + 2) = stack0xfffffffffffffd3b;
    *(undefined4 *)(puStack_18 + 10) = tmpBuffer._3_4_;
    puVar4 = puStack_18 + 0xe;
    uVar2 = '\x1f';
    if ((this->m_sps->sub_pic_hrd_params_present_flag & 1U) != 0) {
      uVar2 = '\x0f';
    }
    puStack_18 = puStack_18 + 0xf;
    *puVar4 = uVar2;
  }
  else {
    *puStack_18 = '\x05';
    puStack_18[1] = '\b';
    puStack_18[2] = 'H';
    puStack_18[3] = 'D';
    puStack_18[4] = 'M';
    puStack_18[5] = 'V';
    puStack_18[6] = 0xff;
    puStack_18[7] = '$';
    fps = MPEGStreamReader::getFPS(&this->super_MPEGStreamReader);
    interlaced = getInterlaced(this);
    width = getStreamWidth(this);
    height = getStreamHeight(this);
    ar = MPEGStreamReader::getStreamAR(&this->super_MPEGStreamReader);
    M2TSStreamInfo::blurayStreamParams
              (fps,interlaced,width,height,ar,tmpBuffer + 0x1fb,tmpBuffer + 0x1fa,tmpBuffer + 0x1f9)
    ;
    pbVar5 = puStack_18 + 9;
    puStack_18[8] = tmpBuffer[0x1fb] << 4 | tmpBuffer[0x1fa];
    puStack_18 = puStack_18 + 10;
    *pbVar5 = tmpBuffer[0x1f9] << 4 | 0xf;
  }
  if (((rez._159_1_ & 1) == 0) && ((this->m_hdr->isDVRPU & 1U) != 0)) {
    iVar3 = setDoViDescriptor(this,puStack_18);
    tmpBuffer._508_4_ = iVar3 + tmpBuffer._508_4_;
  }
  iVar3 = 0xf;
  if ((rez._158_1_ & 1) != 0) {
    iVar3 = 10;
  }
  return iVar3 + tmpBuffer._508_4_;
}

Assistant:

int HEVCStreamReader::getTSDescriptor(uint8_t* dstBuff, const bool blurayMode, const bool hdmvDescriptors)
{
    if (m_firstFrame)
        CheckStreamRez rez = checkStream(m_buffer, static_cast<int>(m_bufEnd - m_buffer));

    int lenDoviDesc = 0;
    if (!blurayMode && m_hdr->isDVRPU)
    {
        // 'DOVI' registration descriptor
        *dstBuff++ = static_cast<uint8_t>(TSDescriptorTag::REGISTRATION);
        *dstBuff++ = 4;  // descriptor length
        *dstBuff++ = 'D';
        *dstBuff++ = 'O';
        *dstBuff++ = 'V';
        *dstBuff++ = 'I';
        lenDoviDesc += 6;
    }

    if (hdmvDescriptors)
    {
        // 'HDMV' registration descriptor
        *dstBuff++ = static_cast<uint8_t>(TSDescriptorTag::HDMV);  // descriptor tag
        *dstBuff++ = 8;                                            // descriptor length
        *dstBuff++ = 'H';
        *dstBuff++ = 'D';
        *dstBuff++ = 'M';
        *dstBuff++ = 'V';
        *dstBuff++ = 0xff;  // stuffing byte

        *dstBuff++ = static_cast<uint8_t>(StreamType::VIDEO_H265);  // stream_conding_type
        uint8_t video_format, frame_rate_index, aspect_ratio_index;
        M2TSStreamInfo::blurayStreamParams(getFPS(), getInterlaced(), getStreamWidth(), getStreamHeight(),
                                           getStreamAR(), &video_format, &frame_rate_index, &aspect_ratio_index);

        *dstBuff++ = static_cast<uint8_t>(video_format << 4 | frame_rate_index);
        *dstBuff++ = static_cast<uint8_t>(aspect_ratio_index << 4 | 0xf);
    }
    else
    {
        uint8_t tmpBuffer[512];

        for (uint8_t* nal = NALUnit::findNextNAL(m_buffer, m_bufEnd); nal < m_bufEnd - 4;
             nal = NALUnit::findNextNAL(nal, m_bufEnd))
        {
            const auto nalType = static_cast<HevcUnit::NalType>((*nal >> 1) & 0x3f);
            const uint8_t* nextNal = NALUnit::findNALWithStartCode(nal, m_bufEnd, true);

            if (nalType == HevcUnit::NalType::SPS)
            {
                const int toDecode = FFMIN(sizeof(tmpBuffer) - 8, (unsigned)(nextNal - nal));
                NALUnit::decodeNAL(nal, nal + toDecode, tmpBuffer, sizeof(tmpBuffer));
                break;
            }
        }

        *dstBuff++ = static_cast<int>(TSDescriptorTag::HEVC);
        *dstBuff++ = 13;  // descriptor length
        memcpy(dstBuff, tmpBuffer + 3, 12);
        dstBuff += 12;
        // flags temporal_layer_subset, HEVC_still_present,
        // HEVC_24hr_picture_present, HDR_WCG unspecified
        *dstBuff++ = m_sps->sub_pic_hrd_params_present_flag ? 0x0f : 0x1f;

        /* HEVC_timing_and_HRD_descriptor
        // mandatory for interlaced video only
        memcpy(dstBuff, "\x3f\x0f\x03\x7f\x7f", 5);
        dstBuff += 5;

        uint32_t N = 1001 * getFPS();
        uint32_t K = 27000000;
        uint32_t num_units_in_tick = 1001;
        if (N % 1000)
        {
            N = 1000 * getFPS();
            num_units_in_tick = 1000;
        }
        N = my_htonl(N);
        K = my_htonl(K);
        num_units_in_tick = my_htonl(num_units_in_tick);
        memcpy(dstBuff, &N, 4);
        dstBuff += 4;
        memcpy(dstBuff, &K, 4);
        dstBuff += 4;
        memcpy(dstBuff, &num_units_in_tick, 4);
        dstBuff += 4;
        */
    }

    if (!blurayMode && m_hdr->isDVRPU)
        lenDoviDesc += setDoViDescriptor(dstBuff);

    return (hdmvDescriptors ? 10 : 15) + lenDoviDesc;
}